

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::HasItem(RecyclableObject *object,uint32 index)

{
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  JavascriptCopyOnAccessNativeIntArray *this;
  undefined4 *puVar6;
  undefined4 extraout_var;
  uint unaff_R12D;
  
  if (object != (RecyclableObject *)0x0) {
    bVar3 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(object);
    if (bVar3) {
      this = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(object);
    }
    else {
      this = (JavascriptCopyOnAccessNativeIntArray *)0x0;
    }
    if (this != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
      JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this);
    }
  }
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    if (((object->type).ptr)->typeId == TypeIds_Null) {
      return 0;
    }
    iVar4 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x24])(object,index);
    if (iVar4 == 0) {
      pTVar1 = (object->type).ptr;
      if ((pTVar1->flags & TypeFlagMask_HasSpecialPrototype) != TypeFlagMask_None) {
        if (pTVar1->typeId != TypeIds_Proxy) {
          iVar5 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[6])(object);
          object = (RecyclableObject *)CONCAT44(extraout_var,iVar5);
          goto LAB_00ab9e8d;
        }
        if ((pTVar1->prototype).ptr !=
            (((((((pTVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)
              ->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).nullValue.
            ptr) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x57a,
                                      "(type->GetPrototype() == instance->GetScriptContext()->GetLibrary()->GetNull())"
                                      ,
                                      "type->GetPrototype() == instance->GetScriptContext()->GetLibrary()->GetNull()"
                                     );
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar6 = 0;
        }
      }
      object = (pTVar1->prototype).ptr;
    }
    else {
      unaff_R12D = (uint)(iVar4 == 1);
    }
LAB_00ab9e8d:
    if (iVar4 != 0) {
      return unaff_R12D;
    }
  } while( true );
}

Assistant:

BOOL JavascriptOperators::HasItem(RecyclableObject* object, uint32 index)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(object);
#endif
        while (!JavascriptOperators::IsNull(object))
        {
            PropertyQueryFlags result;
            if ((result = object->HasItemQuery(index)) != PropertyQueryFlags::Property_NotFound)
            {
                return JavascriptConversion::PropertyQueryFlagsToBoolean(result);
            }
            // CONSIDER: Numeric property values shouldn't be on the prototype for now but if this changes
            // we should add SkipsPrototype support here as well
            object = JavascriptOperators::GetPrototypeNoTrap(object);
        }
        return false;
    }